

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O3

void __thiscall henson::NameMap::create_queue(NameMap *this,string *name)

{
  queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_RCX;
  undefined1 local_68 [32];
  _Elt_pointer local_48;
  _Map_pointer ppvStack_40;
  _Elt_pointer local_38;
  _Elt_pointer pvStack_30;
  _Elt_pointer local_28;
  _Map_pointer ppvStack_20;
  
  local_28 = (_Elt_pointer)0x0;
  ppvStack_20 = (_Map_pointer)0x0;
  local_38 = (_Elt_pointer)0x0;
  pvStack_30 = (_Elt_pointer)0x0;
  local_48 = (_Elt_pointer)0x0;
  ppvStack_40 = (_Map_pointer)0x0;
  local_68._16_8_ = (_Elt_pointer)0x0;
  local_68._24_8_ = (_Elt_pointer)0x0;
  local_68._0_8_ = (_Map_pointer)0x0;
  local_68._8_8_ = 0;
  std::
  _Deque_base<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_initialize_map((_Deque_base<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_68,0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>>>
  ::
  _M_emplace_unique<std::__cxx11::string_const&,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>
            ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::queue<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_bool>
              *)&this->queues_,
             (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::queue<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::deque<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>,std::allocator<mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>>>>>>
              *)name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             in_RCX);
  std::
  deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~deque((deque<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<mpark::variant<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_68);
  return;
}

Assistant:

void        create_queue(const std::string& name)               { queues_.emplace(name, ValueQueue()); }